

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::AsyncStreamFd::writeInternal
          (AsyncStreamFd *this,ArrayPtr<const_unsigned_char> firstPiece,
          ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces,ArrayPtr<const_int> fds)

{
  ArrayPtr<const_int> fds_00;
  ArrayPtr<const_int> fds_01;
  char *pcVar1;
  char *start;
  AsyncStreamFd *pAVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  uchar *puVar6;
  iovec *piVar7;
  ArrayPtr<const_unsigned_char> *pAVar8;
  void *pvVar9;
  ulong uVar10;
  kj *this_00;
  int *__src;
  char *pcVar11;
  size_t size;
  ArrayPtr<const_unsigned_char> *in_R9;
  ArrayPtr<iovec> AVar12;
  ArrayPtr<void_*> AVar13;
  ArrayPtr<unsigned_char> AVar14;
  ArrayPtr<const_unsigned_char> AVar15;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> AVar16;
  ArrayPtr<const_unsigned_char> firstPiece_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces_00;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces_01;
  long *local_5e0;
  Fault local_498;
  Fault f_4;
  long *local_488;
  undefined1 local_480 [8];
  DebugComparison<long_&,_unsigned_long> _kjCondition_1;
  size_t sStack_450;
  ArrayPtr<const_int> local_428;
  AsyncStreamFd *local_418;
  ArrayPtr<const_unsigned_char> *pAStack_410;
  ArrayPtr<const_unsigned_char> local_408;
  ArrayPtr<const_unsigned_char> local_3f0;
  Fault local_3e0;
  Fault f_3;
  undefined1 local_398 [16];
  Fault f_2;
  SyscallResult local_36c;
  undefined1 auStack_368 [4];
  SyscallResult _kjSyscallResult_1;
  cmsghdr *cmsg;
  ArrayPtr<unsigned_char> cmsgBytes;
  ArrayPtr<void_*> cmsgSpace;
  Array<void_*> cmsgSpace_heap;
  void *cmsgSpace_stack [16];
  bool cmsgSpace_isOnStack;
  size_t cmsgSpace_size;
  size_t msgWords;
  size_t msgBytes;
  msghdr msg;
  size_t local_238;
  Fault local_230;
  Fault f_1;
  SyscallResult local_20c;
  undefined1 auStack_208 [4];
  SyscallResult _kjSyscallResult;
  ssize_t n;
  Fault local_1f8;
  Fault f;
  size_t local_1e8;
  DebugExpression<unsigned_long> local_1e0;
  undefined1 local_1d8 [8];
  DebugComparison<unsigned_long,_int> _kjCondition;
  ArrayDisposer *pAStack_1a8;
  uint i;
  size_t iovTotal;
  undefined1 local_190 [8];
  ArrayPtr<iovec> iov;
  Array<iovec> iov_heap;
  iovec iov_stack [16];
  unsigned_long uStack_58;
  bool iov_isOnStack;
  size_t local_50;
  size_t iov_size;
  size_t iovmax;
  AsyncStreamFd *this_local;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> morePieces_local;
  ArrayPtr<const_unsigned_char> firstPiece_local;
  
  this_local = (AsyncStreamFd *)morePieces.size_;
  morePieces_local.size_ = firstPiece.size_;
  firstPiece_00.ptr = firstPiece.ptr;
  iov_size = 0x400;
  iovmax = (size_t)firstPiece_00.ptr;
  morePieces_local.ptr = in_R9;
  sVar5 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                    ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
  uStack_58 = sVar5 + 1;
  local_50 = min<unsigned_long,unsigned_long_const&>(&stack0xffffffffffffffa8,&iov_size);
  if (local_50 < 0x11) {
    Array<iovec>::Array((Array<iovec> *)&iov.size_,(void *)0x0);
    AVar12 = arrayPtr<iovec>((iovec *)&iov_heap.disposer,local_50);
  }
  else {
    heapArray<iovec>((Array<iovec> *)&iov.size_,local_50);
    AVar12 = kj::Array::operator_cast_to_ArrayPtr((Array *)&iov.size_);
  }
  iov.ptr = (iovec *)AVar12.size_;
  local_190 = (undefined1  [8])AVar12.ptr;
  pAStack_1a8 = (ArrayDisposer *)0x0;
  puVar6 = ArrayPtr<const_unsigned_char>::begin
                     ((ArrayPtr<const_unsigned_char> *)&morePieces_local.size_);
  piVar7 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_190,0);
  piVar7->iov_base = puVar6;
  sVar5 = ArrayPtr<const_unsigned_char>::size
                    ((ArrayPtr<const_unsigned_char> *)&morePieces_local.size_);
  piVar7 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_190,0);
  piVar7->iov_len = sVar5;
  piVar7 = ArrayPtr<iovec>::operator[]((ArrayPtr<iovec> *)local_190,0);
  pAStack_1a8 = (ArrayDisposer *)((long)&pAStack_1a8->_vptr_ArrayDisposer + piVar7->iov_len);
  for (_kjCondition._36_4_ = 1; uVar10 = (ulong)(uint)_kjCondition._36_4_,
      sVar5 = ArrayPtr<iovec>::size((ArrayPtr<iovec> *)local_190), uVar10 < sVar5;
      _kjCondition._36_4_ = _kjCondition._36_4_ + 1) {
    pAVar8 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,
                        (ulong)(_kjCondition._36_4_ - 1));
    puVar6 = ArrayPtr<const_unsigned_char>::begin(pAVar8);
    piVar7 = ArrayPtr<iovec>::operator[]
                       ((ArrayPtr<iovec> *)local_190,(ulong)(uint)_kjCondition._36_4_);
    piVar7->iov_base = puVar6;
    pAVar8 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                       ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,
                        (ulong)(_kjCondition._36_4_ - 1));
    sVar5 = ArrayPtr<const_unsigned_char>::size(pAVar8);
    piVar7 = ArrayPtr<iovec>::operator[]
                       ((ArrayPtr<iovec> *)local_190,(ulong)(uint)_kjCondition._36_4_);
    piVar7->iov_len = sVar5;
    piVar7 = ArrayPtr<iovec>::operator[]
                       ((ArrayPtr<iovec> *)local_190,(ulong)(uint)_kjCondition._36_4_);
    pAStack_1a8 = (ArrayDisposer *)((long)&pAStack_1a8->_vptr_ArrayDisposer + piVar7->iov_len);
  }
  if (pAStack_1a8 == (ArrayDisposer *)0x0) {
    local_1e8 = ArrayPtr<const_int>::size(&fds);
    local_1e0 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1e8);
    f.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_int> *)local_1d8,&local_1e0,
               (int *)((long)&f.exception + 4));
    bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1d8);
    if (!bVar3) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[30]>
                (&local_1f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x304,FAILED,"fds.size() == 0","_kjCondition,\"can\'t write FDs without bytes\"",
                 (DebugComparison<unsigned_long,_int> *)local_1d8,
                 (char (*) [30])"can\'t write FDs without bytes");
      kj::_::Debug::Fault::fatal(&local_1f8);
    }
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    goto LAB_00906722;
  }
  sVar5 = ArrayPtr<const_int>::size(&fds);
  if (sVar5 == 0) {
    f_1.exception = (Exception *)auStack_208;
    local_20c = kj::_::Debug::
                syscall<kj::(anonymous_namespace)::AsyncStreamFd::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::ArrayPtr<int_const>)::_lambda()_1_>
                          ((anon_class_24_3_c5cf46a9 *)&f_1,true);
    pvVar9 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_20c);
    if (pvVar9 == (void *)0x0) {
      iVar4 = kj::_::Debug::SyscallResult::getErrorNumber(&local_20c);
      local_238 = ArrayPtr<iovec>::size((ArrayPtr<iovec> *)local_190);
      kj::_::Debug::Fault::Fault<int,unsigned_long&,unsigned_long>
                (&local_230,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x30a,iVar4,"n = ::writev(fd, iov.begin(), iov.size())","iovTotal, iov.size()",
                 (unsigned_long *)&stack0xfffffffffffffe58,&local_238);
      kj::_::Debug::Fault::~Fault(&local_230);
LAB_009061e0:
      kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
      goto LAB_00906722;
    }
  }
  else {
    ArrayPtr<iovec>::begin((ArrayPtr<iovec> *)local_190);
    ArrayPtr<iovec>::size((ArrayPtr<iovec> *)local_190);
    sVar5 = ArrayPtr<const_int>::size(&fds);
    uVar10 = sVar5 * 4 + 7 & 0xfffffffffffffff8;
    this_00 = (kj *)(uVar10 + 0x17 >> 3);
    if (this_00 < (kj *)0x11) {
      Array<void_*>::Array((Array<void_*> *)&cmsgSpace.size_,(void *)0x0);
      AVar13 = arrayPtr<void*>(&cmsgSpace_heap.disposer,(size_t)this_00);
    }
    else {
      heapArray<void*>((Array<void_*> *)&cmsgSpace.size_,this_00,size);
      AVar13 = kj::Array::operator_cast_to_ArrayPtr((Array *)&cmsgSpace.size_);
    }
    cmsgSpace.ptr = (void **)AVar13.size_;
    cmsgBytes.size_ = (size_t)AVar13.ptr;
    AVar14 = ArrayPtr<void_*>::asBytes((ArrayPtr<void_*> *)&cmsgBytes.size_);
    cmsgBytes.ptr = (uchar *)AVar14.size_;
    cmsg = (cmsghdr *)AVar14.ptr;
    puVar6 = ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&cmsg);
    sVar5 = ArrayPtr<unsigned_char>::size((ArrayPtr<unsigned_char> *)&cmsg);
    memset(puVar6,0,sVar5);
    local_5e0 = (long *)ArrayPtr<unsigned_char>::begin((ArrayPtr<unsigned_char> *)&cmsg);
    if (uVar10 + 0x10 < 0x10) {
      local_5e0 = (long *)0x0;
    }
    *(undefined4 *)(local_5e0 + 1) = 1;
    *(undefined4 *)((long)local_5e0 + 0xc) = 1;
    sVar5 = ArrayPtr<const_int>::size(&fds);
    *local_5e0 = sVar5 * 4 + 0x10;
    __src = ArrayPtr<const_int>::begin(&fds);
    AVar15 = ArrayPtr<const_int>::asBytes(&fds);
    _auStack_368 = (AsyncStreamFd *)AVar15.ptr;
    sVar5 = ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)auStack_368);
    memcpy(local_5e0 + 2,__src,sVar5);
    f_2.exception = (Exception *)auStack_208;
    local_36c = kj::_::Debug::
                syscall<kj::(anonymous_namespace)::AsyncStreamFd::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::ArrayPtr<int_const>)::_lambda()_2_>
                          ((anon_class_24_3_c5cf561a *)&f_2,true);
    pvVar9 = kj::_::Debug::SyscallResult::operator_cast_to_void_(&local_36c);
    if (pvVar9 == (void *)0x0) {
      iVar4 = kj::_::Debug::SyscallResult::getErrorNumber(&local_36c);
      kj::_::Debug::Fault::Fault
                ((Fault *)(local_398 + 8),
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x32f,iVar4,"n = ::sendmsg(fd, &msg, 0)","");
      n._4_4_ = 0xb;
      kj::_::Debug::Fault::~Fault((Fault *)(local_398 + 8));
    }
    else {
      n._4_4_ = 0;
    }
    Array<void_*>::~Array((Array<void_*> *)&cmsgSpace.size_);
    if (n._4_4_ != 0) {
      if (n._4_4_ != 0xb) goto LAB_00906722;
      goto LAB_009061e0;
    }
  }
  AVar16.size_ = (size_t)morePieces_local.ptr;
  AVar16.ptr = (ArrayPtr<const_unsigned_char> *)this_local;
  if ((long)_auStack_208 < 0) {
    UnixEventPort::FdObserver::whenBecomesWritable((FdObserver *)local_398);
    f_3.exception = (Exception *)morePieces_local.size_;
    Promise<void>::
    then<kj::(anonymous_namespace)::AsyncStreamFd::writeInternal(kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<kj::ArrayPtr<unsigned_char_const>const>,kj::ArrayPtr<int_const>)::_lambda()_3_>
              ((Promise<void> *)this,(Type *)local_398);
    Promise<void>::~Promise((Promise<void> *)local_398);
  }
  else {
    if (_auStack_208 == (char *)0x0) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[31]>
                (&local_3e0,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                 ,0x350,FAILED,(char *)0x0,"\"non-empty sendmsg() returned 0\"",
                 (char (*) [31])"non-empty sendmsg() returned 0");
      kj::_::Debug::Fault::fatal(&local_3e0);
    }
    while( true ) {
      pcVar1 = _auStack_208;
      morePieces_local.ptr = (ArrayPtr<const_unsigned_char> *)AVar16.size_;
      this_local = (AsyncStreamFd *)AVar16.ptr;
      pcVar11 = (char *)ArrayPtr<const_unsigned_char>::size
                                  ((ArrayPtr<const_unsigned_char> *)&morePieces_local.size_);
      start = _auStack_208;
      if (pcVar1 < pcVar11) break;
      sVar5 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
      if (sVar5 == 0) {
        local_488 = (long *)kj::_::DebugExpressionStart::operator<<
                                      ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                       (long *)auStack_208);
        f_4.exception =
             (Exception *)
             ArrayPtr<const_unsigned_char>::size
                       ((ArrayPtr<const_unsigned_char> *)&morePieces_local.size_);
        kj::_::DebugExpression<long&>::operator==
                  ((DebugComparison<long_&,_unsigned_long> *)local_480,
                   (DebugExpression<long&> *)&local_488,(unsigned_long *)&f_4);
        bVar3 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_480);
        if (!bVar3) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<long&,unsigned_long>&,long&>
                    (&local_498,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io-unix.c++"
                     ,0x366,FAILED,"n == firstPiece.size()","_kjCondition,n",
                     (DebugComparison<long_&,_unsigned_long> *)local_480,(long *)auStack_208);
          kj::_::Debug::Fault::fatal(&local_498);
        }
        kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
        goto LAB_00906722;
      }
      sVar5 = ArrayPtr<const_unsigned_char>::size
                        ((ArrayPtr<const_unsigned_char> *)&morePieces_local.size_);
      _auStack_208 = _auStack_208 + -sVar5;
      sVar5 = ArrayPtr<const_unsigned_char>::size
                        ((ArrayPtr<const_unsigned_char> *)&morePieces_local.size_);
      pAStack_1a8 = (ArrayDisposer *)((long)pAStack_1a8 - sVar5);
      pAVar8 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::operator[]
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,0);
      morePieces_local.size_ = (size_t)pAVar8->ptr;
      sVar5 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::size
                        ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local);
      AVar16 = ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_>::slice
                         ((ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> *)&this_local,1,sVar5)
      ;
    }
    sVar5 = ArrayPtr<const_unsigned_char>::size
                      ((ArrayPtr<const_unsigned_char> *)&morePieces_local.size_);
    local_3f0 = ArrayPtr<const_unsigned_char>::slice
                          ((ArrayPtr<const_unsigned_char> *)&morePieces_local.size_,(size_t)start,
                           sVar5);
    pAVar2 = this_local;
    pAVar8 = (ArrayPtr<const_unsigned_char> *)local_3f0.size_;
    puVar6 = local_3f0.ptr;
    pAStack_1a8 = (ArrayDisposer *)((long)pAStack_1a8 - (long)_auStack_208);
    morePieces_local.size_ = (size_t)puVar6;
    if (pAStack_1a8 == (ArrayDisposer *)0x0) {
      local_418 = this_local;
      pAStack_410 = morePieces_local.ptr;
      local_408 = local_3f0;
      ArrayPtr<const_int>::ArrayPtr(&local_428,(void *)0x0);
      fds_00.size_ = local_428.size_;
      fds_00.ptr = local_428.ptr;
      firstPiece_00.size_ = (size_t)local_408.ptr;
      morePieces_00.size_ = (size_t)local_418;
      morePieces_00.ptr = (ArrayPtr<const_unsigned_char> *)local_408.size_;
      writeInternal(this,firstPiece_00,morePieces_00,fds_00);
    }
    else {
      ArrayPtr<const_int>::ArrayPtr((ArrayPtr<const_int> *)&_kjCondition_1.result,(void *)0x0);
      fds_01.size_ = sStack_450;
      fds_01.ptr = (int *)_kjCondition_1._32_8_;
      AVar15.size_ = (size_t)puVar6;
      AVar15.ptr = firstPiece_00.ptr;
      morePieces_01.size_ = (size_t)pAVar2;
      morePieces_01.ptr = pAVar8;
      writeInternal(this,AVar15,morePieces_01,fds_01);
    }
  }
LAB_00906722:
  Array<iovec>::~Array((Array<iovec> *)&iov.size_);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> writeInternal(ArrayPtr<const byte> firstPiece,
                              ArrayPtr<const ArrayPtr<const byte>> morePieces,
                              ArrayPtr<const int> fds) {
    const size_t iovmax = kj::miniposix::iovMax();
    // If there are more than IOV_MAX pieces, we'll only write the first IOV_MAX for now, and
    // then we'll loop later.
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(1 + morePieces.size(), iovmax), 16, 128);
    size_t iovTotal = 0;

    // writev() interface is not const-correct.  :(
    iov[0].iov_base = const_cast<byte*>(firstPiece.begin());
    iov[0].iov_len = firstPiece.size();
    iovTotal += iov[0].iov_len;
    for (uint i = 1; i < iov.size(); i++) {
      iov[i].iov_base = const_cast<byte*>(morePieces[i - 1].begin());
      iov[i].iov_len = morePieces[i - 1].size();
      iovTotal += iov[i].iov_len;
    }

    if (iovTotal == 0) {
      KJ_REQUIRE(fds.size() == 0, "can't write FDs without bytes");
      return kj::READY_NOW;
    }

    ssize_t n;
    if (fds.size() == 0) {
      KJ_NONBLOCKING_SYSCALL(n = ::writev(fd, iov.begin(), iov.size()), iovTotal, iov.size()) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    } else {
      struct msghdr msg;
      memset(&msg, 0, sizeof(msg));
      msg.msg_iov = iov.begin();
      msg.msg_iovlen = iov.size();

      // Allocate space to send a cmsg.
      size_t msgBytes = CMSG_SPACE(sizeof(int) * fds.size());
      // On Linux, CMSG_SPACE will align to a word-size boundary, but on Mac it always aligns to a
      // 32-bit boundary. I guess aligning to 32 bits helps avoid the problem where you
      // surprisingly end up with space for two file descriptors when you only wanted one. However,
      // cmsghdr's preferred alignment is word-size (it contains a size_t). If we stack-allocate
      // the buffer, we need to make sure it is aligned properly (maybe not on x64, but maybe on
      // other platforms), so we want to allocate an array of words (we use void*). So... we use
      // CMSG_SPACE() and then additionally round up to deal with Mac.
      size_t msgWords = (msgBytes + sizeof(void*) - 1) / sizeof(void*);
      KJ_STACK_ARRAY(void*, cmsgSpace, msgWords, 16, 256);
      auto cmsgBytes = cmsgSpace.asBytes();
      memset(cmsgBytes.begin(), 0, cmsgBytes.size());
      msg.msg_control = cmsgBytes.begin();
      msg.msg_controllen = msgBytes;

      struct cmsghdr* cmsg = CMSG_FIRSTHDR(&msg);
      cmsg->cmsg_level = SOL_SOCKET;
      cmsg->cmsg_type = SCM_RIGHTS;
      cmsg->cmsg_len = CMSG_LEN(sizeof(int) * fds.size());
      memcpy(CMSG_DATA(cmsg), fds.begin(), fds.asBytes().size());

      KJ_NONBLOCKING_SYSCALL(n = ::sendmsg(fd, &msg, 0)) {
        // Error.

        // We can't "return kj::READY_NOW;" inside this block because it causes a memory leak due to
        // a bug that exists in both Clang and GCC:
        //   http://gcc.gnu.org/bugzilla/show_bug.cgi?id=33799
        //   http://llvm.org/bugs/show_bug.cgi?id=12286
        goto error;
      }
    }

    if (false) {
    error:
      return kj::READY_NOW;
    }

    if (n < 0) {
      // Got EAGAIN. Nothing was written.
      return observer.whenBecomesWritable().then([firstPiece, morePieces, fds, this]() {
        return writeInternal(firstPiece, morePieces, fds);
      });
    } else if (n == 0) {
      // Why would a sendmsg() with a non-empty message ever return 0 when writing to a stream
      // socket? If there's no room in the send buffer, it should fail with EAGAIN. If the
      // connection is closed, it should fail with EPIPE. Various documents and forum posts around
      // the internet claim this can happen but no one seems to know when. My guess is it can only
      // happen if we try to send an empty message -- which we didn't. So I think this is
      // impossible. If it is possible, we need to figure out how to correctly handle it, which
      // depends on what caused it.
      //
      // Note in particular that if 0 is a valid return here, and we sent an SCM_RIGHTS message,
      // we need to know whether the message was sent or not, in order to decide whether to retry
      // sending it!
      KJ_FAIL_ASSERT("non-empty sendmsg() returned 0");
    }

    // Non-zero bytes were written. This also implies that *all* FDs were written.

    // Discard all data that was written, then issue a new write for what's left (if any).
    for (;;) {
      if (n < firstPiece.size()) {
        // Only part of the first piece was consumed.  Wait for buffer space and then write again.
        firstPiece = firstPiece.slice(n, firstPiece.size());
        iovTotal -= n;

        if (iovTotal == 0) {
          // Oops, what actually happened is that we hit the IOV_MAX limit. Don't wait.
          return writeInternal(firstPiece, morePieces, nullptr);
        }

        // As with read(), we cannot assume that a short write() really means the write buffer is
        // full (see comments in the read path above). We have to write again.
        return writeInternal(firstPiece, morePieces, nullptr);
      } else if (morePieces.size() == 0) {
        // First piece was fully-consumed and there are no more pieces, so we're done.
        KJ_DASSERT(n == firstPiece.size(), n);
        return READY_NOW;
      } else {
        // First piece was fully consumed, so move on to the next piece.
        n -= firstPiece.size();
        iovTotal -= firstPiece.size();
        firstPiece = morePieces[0];
        morePieces = morePieces.slice(1, morePieces.size());
      }
    }
  }